

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandInit(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Abc_Ntk_t *pNtk;
  size_t sVar9;
  Abc_Obj_t *pAVar10;
  time_t tVar11;
  Aig_Man_t *pAig;
  Vec_Int_t *p;
  char *pcVar12;
  long lVar13;
  char *pcVar14;
  uint local_50;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  bVar5 = false;
  Extra_UtilGetoptReset();
  bVar1 = false;
  bVar3 = false;
  bVar2 = false;
  bVar4 = false;
  local_50 = 0;
  pcVar12 = (char *)0x0;
  do {
    while (iVar6 = Extra_UtilGetopt(argc,argv,"Szordcnh"), iVar6 == 0x53) {
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by a file name.\n");
LAB_00234ea5:
        iVar6 = -2;
        Abc_Print(-2,"usage: init [-zordcnh] [-S <init_string>]\n");
        Abc_Print(-2,"\t         resets initial states of all latches\n");
        pcVar14 = "yes";
        pcVar12 = "yes";
        if (!bVar5) {
          pcVar12 = "no";
        }
        Abc_Print(-2,"\t-z     : set zeros initial states [default = %s]\n",pcVar12);
        pcVar12 = "yes";
        if (!bVar1) {
          pcVar12 = "no";
        }
        Abc_Print(-2,"\t-o     : set ones initial states [default = %s]\n",pcVar12);
        pcVar12 = "yes";
        if (!bVar2) {
          pcVar12 = "no";
        }
        Abc_Print(-2,"\t-d     : set don\'t-care initial states [default = %s]\n",pcVar12);
        pcVar12 = "yes";
        if (!bVar3) {
          pcVar12 = "no";
        }
        Abc_Print(-2,"\t-r     : set random initial states [default = %s]\n",pcVar12);
        pcVar12 = "yes";
        if (!bVar4) {
          pcVar12 = "no";
        }
        Abc_Print(-2,
                  "\t-c     : set failure current state from the CEX (and run \"zero\") [default = %s]\n"
                  ,pcVar12);
        if (local_50 == 0) {
          pcVar14 = "no";
        }
        Abc_Print(-2,
                  "\t-n     : set next state after failure from the CEX (and run \"zero\") [default = %s]\n"
                  ,pcVar14);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        pcVar12 = "\t-S str : (optional) initial state  [default = unused]\n";
LAB_00234f97:
        Abc_Print(iVar6,pcVar12);
        return 1;
      }
      pcVar12 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
    }
    if (iVar6 == -1) {
      if (pNtk != (Abc_Ntk_t *)0x0) {
        uVar7 = pNtk->nObjCounts[8];
        if (uVar7 == 0) {
          pcVar12 = "The current network is combinational.\n";
          iVar6 = 0;
        }
        else {
          if (pcVar12 != (char *)0x0) {
            sVar9 = strlen(pcVar12);
            if (uVar7 != (uint)sVar9) {
              Abc_Print(-1,"The length of init string (%d) differs from the number of flops (%d).\n"
                        ,sVar9,(ulong)uVar7);
              return 1;
            }
            for (lVar13 = 0; lVar13 < pNtk->vBoxes->nSize; lVar13 = lVar13 + 1) {
              pAVar10 = Abc_NtkBox(pNtk,(int)lVar13);
              if ((*(uint *)&pAVar10->field_0x14 & 0xf) == 8) {
                if (pcVar12[lVar13] == '1') {
                  Abc_LatchSetInit1(pAVar10);
                }
                else if (pcVar12[lVar13] == '0') {
                  Abc_LatchSetInit0(pAVar10);
                }
                else {
                  Abc_LatchSetInitDc(pAVar10);
                }
              }
            }
            return 0;
          }
          if (bVar5) {
            for (iVar6 = 0; iVar6 < pNtk->vBoxes->nSize; iVar6 = iVar6 + 1) {
              pAVar10 = Abc_NtkBox(pNtk,iVar6);
              if ((*(uint *)&pAVar10->field_0x14 & 0xf) == 8) {
                Abc_LatchSetInit0(pAVar10);
              }
            }
            return 0;
          }
          if (bVar1) {
            for (iVar6 = 0; iVar6 < pNtk->vBoxes->nSize; iVar6 = iVar6 + 1) {
              pAVar10 = Abc_NtkBox(pNtk,iVar6);
              if ((*(uint *)&pAVar10->field_0x14 & 0xf) == 8) {
                Abc_LatchSetInit1(pAVar10);
              }
            }
            return 0;
          }
          if (bVar3) {
            tVar11 = time((time_t *)0x0);
            srand((uint)tVar11);
            for (iVar6 = 0; iVar6 < pNtk->vBoxes->nSize; iVar6 = iVar6 + 1) {
              pAVar10 = Abc_NtkBox(pNtk,iVar6);
              if ((*(uint *)&pAVar10->field_0x14 & 0xf) == 8) {
                uVar7 = rand();
                if ((uVar7 & 1) == 0) {
                  Abc_LatchSetInit0(pAVar10);
                }
                else {
                  Abc_LatchSetInit1(pAVar10);
                }
              }
            }
            return 0;
          }
          if (bVar2) {
            for (iVar6 = 0; iVar6 < pNtk->vBoxes->nSize; iVar6 = iVar6 + 1) {
              pAVar10 = Abc_NtkBox(pNtk,iVar6);
              if ((*(uint *)&pAVar10->field_0x14 & 0xf) == 8) {
                Abc_LatchSetInitDc(pAVar10);
              }
            }
            return 0;
          }
          if (bVar4 || local_50 != 0) {
            if ((bVar4) && (local_50 != 0)) {
              pcVar12 = "The two options (-c and -n) are incompatible.\n";
            }
            else if (pNtk->ntkType == ABC_NTK_STRASH) {
              if (pAbc->pCex != (Abc_Cex_t *)0x0) {
                pAig = Abc_NtkToDar(pNtk,0,1);
                p = Saig_ManReturnFailingState(pAig,pAbc->pCex,local_50);
                Aig_ManStop(pAig);
                for (iVar6 = 0; iVar6 < pNtk->vBoxes->nSize; iVar6 = iVar6 + 1) {
                  pAVar10 = Abc_NtkBox(pNtk,iVar6);
                  if ((*(uint *)&pAVar10->field_0x14 & 0xf) == 8) {
                    iVar8 = Vec_IntEntry(p,iVar6);
                    if (iVar8 == 0) {
                      Abc_LatchSetInit0(pAVar10);
                    }
                    else {
                      Abc_LatchSetInit1(pAVar10);
                    }
                  }
                }
                Vec_IntFree(p);
                return 0;
              }
              pcVar12 = "The current CEX is not available.\n";
            }
            else {
              pcVar12 = "The current network should be an AIG.\n";
            }
          }
          else {
            pcVar12 = "The initial states remain unchanged.\n";
          }
          iVar6 = -1;
        }
        Abc_Print(iVar6,pcVar12);
        return 0;
      }
      pcVar12 = "Empty network.\n";
      iVar6 = -1;
      goto LAB_00234f97;
    }
    if (iVar6 == 99) {
      bVar4 = (bool)(bVar4 ^ 1);
    }
    else if (iVar6 == 100) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else if (iVar6 == 0x6e) {
      local_50 = local_50 ^ 1;
    }
    else if (iVar6 == 0x6f) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    else if (iVar6 == 0x72) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    else {
      if (iVar6 != 0x7a) goto LAB_00234ea5;
      bVar5 = (bool)(bVar5 ^ 1);
    }
  } while( true );
}

Assistant:

int Abc_CommandInit( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pObj;
    char * pInitStr = NULL;
    int fZeros    = 0;
    int fOnes     = 0;
    int fRandom   = 0;
    int fDontCare = 0;
    int fUseCexCs = 0;
    int fUseCexNs = 0;
    int c, i;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Szordcnh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a file name.\n" );
                goto usage;
            }
            pInitStr = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'z':
            fZeros ^= 1;
            break;
        case 'o':
            fOnes ^= 1;
            break;
        case 'r':
            fRandom ^= 1;
            break;
        case 'd':
            fDontCare ^= 1;
            break;
        case 'c':
            fUseCexCs ^= 1;
            break;
        case 'n':
            fUseCexNs ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( 0, "The current network is combinational.\n" );
        return 0;
    }

    if ( pInitStr != NULL )
    {
        if ( (int)strlen(pInitStr) != Abc_NtkLatchNum(pNtk) )
        {
            Abc_Print( -1, "The length of init string (%d) differs from the number of flops (%d).\n", strlen(pInitStr), Abc_NtkLatchNum(pNtk) );
            return 1;
        }
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( pInitStr[i] == '0' )
                Abc_LatchSetInit0( pObj );
            else if ( pInitStr[i] == '1' )
                Abc_LatchSetInit1( pObj );
            else
                Abc_LatchSetInitDc( pObj );
        return 0;
    }

    if ( fZeros )
    {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_LatchSetInit0( pObj );
    }
    else if ( fOnes )
    {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_LatchSetInit1( pObj );
    }
    else if ( fRandom )
    {
        srand( time(NULL) );
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( rand() & 1 )
                Abc_LatchSetInit1( pObj );
            else
                Abc_LatchSetInit0( pObj );
    }
    else if ( fDontCare )
    {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_LatchSetInitDc( pObj );
    }
    else if ( fUseCexCs || fUseCexNs )
    {
        extern Vec_Int_t * Saig_ManReturnFailingState( Aig_Man_t * pMan, Abc_Cex_t * p, int fNextOne );
        Aig_Man_t * pMan;
        Vec_Int_t * vFailState;
        if ( fUseCexCs && fUseCexNs )
        {
            Abc_Print( -1, "The two options (-c and -n) are incompatible.\n" );
            return 0;
        }
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            Abc_Print( -1, "The current network should be an AIG.\n" );
            return 0;
        }
        if ( pAbc->pCex == NULL )
        {
            Abc_Print( -1, "The current CEX is not available.\n" );
            return 0;
        }
        pMan = Abc_NtkToDar( pNtk, 0, 1 );
        vFailState = Saig_ManReturnFailingState( pMan, pAbc->pCex, fUseCexNs );
        //Vec_IntPrint( vFailState );
        Aig_ManStop( pMan );
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( Vec_IntEntry( vFailState, i ) )
                Abc_LatchSetInit1( pObj );
            else
                Abc_LatchSetInit0( pObj );
        Vec_IntFree( vFailState );
    }
    else
        Abc_Print( -1, "The initial states remain unchanged.\n" );
    return 0;

usage:
    Abc_Print( -2, "usage: init [-zordcnh] [-S <init_string>]\n" );
    Abc_Print( -2, "\t         resets initial states of all latches\n" );
    Abc_Print( -2, "\t-z     : set zeros initial states [default = %s]\n", fZeros? "yes": "no" );
    Abc_Print( -2, "\t-o     : set ones initial states [default = %s]\n", fOnes? "yes": "no" );
    Abc_Print( -2, "\t-d     : set don't-care initial states [default = %s]\n", fDontCare? "yes": "no" );
    Abc_Print( -2, "\t-r     : set random initial states [default = %s]\n", fRandom? "yes": "no" );
    Abc_Print( -2, "\t-c     : set failure current state from the CEX (and run \"zero\") [default = %s]\n", fUseCexCs? "yes": "no" );
    Abc_Print( -2, "\t-n     : set next state after failure from the CEX (and run \"zero\") [default = %s]\n", fUseCexNs? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t-S str : (optional) initial state  [default = unused]\n" );
    return 1;
}